

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a64func.cpp
# Opt level: O2

Error asmjit::v1_14::a64::FuncInternal::initCallConv
                (CallConv *cc,CallConvId ccId,Environment *environment)

{
  Array<unsigned_char,_4UL> *this;
  Array<unsigned_char,_4UL> *this_00;
  uchar *puVar1;
  RegMask regs;
  RegMask regs_00;
  undefined7 in_register_00000031;
  RegGroup local_3b [7];
  undefined4 local_34;
  
  cc->_arch = environment->_arch;
  local_34 = (undefined4)CONCAT71(in_register_00000031,ccId);
  cc->_strategy = (environment->_platformABI == kDarwin) * '\x03';
  local_3b[2] = 0;
  this = &cc->_saveRestoreRegSize;
  puVar1 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                     (this,local_3b + 2);
  *puVar1 = '\b';
  local_3b[1] = 1;
  puVar1 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                     (this,local_3b + 1);
  *puVar1 = '\b';
  local_3b[6] = 0;
  this_00 = &cc->_saveRestoreAlignment;
  puVar1 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                     (this_00,local_3b + 6);
  *puVar1 = '\x10';
  local_3b[5] = 1;
  puVar1 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                     (this_00,local_3b + 5);
  *puVar1 = '\x10';
  local_3b[4] = 2;
  puVar1 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                     (this_00,local_3b + 4);
  *puVar1 = '\x01';
  local_3b[3] = 3;
  puVar1 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                     (this_00,local_3b + 3);
  *puVar1 = '\x01';
  CallConv::setPassedOrder(cc,k0,0,1,2,3,4,5,6,7);
  CallConv::setPassedOrder(cc,kVec,0,1,2,3,4,5,6,7);
  cc->_naturalStackAlignment = '\x10';
  if ((CallConvId)local_34 < 8) {
    cc->_id = kCDecl;
    regs_00 = 0xff00;
    regs = 0x7ffc0000;
  }
  else {
    cc->_id = (CallConvId)local_34;
    local_3b[0] = kVec;
    puVar1 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::RegGroup>(this,local_3b);
    *puVar1 = '\x10';
    regs_00 = 0xfffffff0;
    regs = 0x7ffffff0;
  }
  CallConv::setPreservedRegs(cc,k0,regs);
  CallConv::setPreservedRegs(cc,kVec,regs_00);
  return 0;
}

Assistant:

ASMJIT_FAVOR_SIZE Error initCallConv(CallConv& cc, CallConvId ccId, const Environment& environment) noexcept {
  cc.setArch(environment.arch());
  cc.setStrategy(environment.isDarwin() ? CallConvStrategy::kAArch64Apple : CallConvStrategy::kDefault);

  cc.setSaveRestoreRegSize(RegGroup::kGp, 8);
  cc.setSaveRestoreRegSize(RegGroup::kVec, 8);
  cc.setSaveRestoreAlignment(RegGroup::kGp, 16);
  cc.setSaveRestoreAlignment(RegGroup::kVec, 16);
  cc.setSaveRestoreAlignment(RegGroup::kMask, 1);
  cc.setSaveRestoreAlignment(RegGroup::kExtraVirt3, 1);
  cc.setPassedOrder(RegGroup::kGp, 0, 1, 2, 3, 4, 5, 6, 7);
  cc.setPassedOrder(RegGroup::kVec, 0, 1, 2, 3, 4, 5, 6, 7);
  cc.setNaturalStackAlignment(16);

  if (shouldTreatAsCDecl(ccId)) {
    // ARM doesn't have that many calling conventions as we can find in X86 world, treat most conventions as __cdecl.
    cc.setId(CallConvId::kCDecl);
    cc.setPreservedRegs(RegGroup::kGp, Support::bitMask(Gp::kIdOs, 19, 20, 21, 22, 23, 24, 25, 26, 27, 28, 29, 30));
    cc.setPreservedRegs(RegGroup::kVec, Support::bitMask(8, 9, 10, 11, 12, 13, 14, 15));
  }
  else {
    cc.setId(ccId);
    cc.setSaveRestoreRegSize(RegGroup::kVec, 16);
    cc.setPreservedRegs(RegGroup::kGp, Support::bitMask(4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15, 16, 17, 18, 19, 20, 21, 22, 23, 24, 25, 26, 27, 28, 29, 30));
    cc.setPreservedRegs(RegGroup::kVec, Support::bitMask(4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15, 16, 17, 18, 19, 20, 21, 22, 23, 24, 25, 26, 27, 28, 29, 30, 31));
  }

  return kErrorOk;
}